

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall slang::parsing::Parser::Parser(Parser *this,Preprocessor *preprocessor,Bag *options)

{
  ParserOptions PVar1;
  LanguageVersion languageVersion;
  BumpAllocator *alloc;
  ParserMetadata *in_RSI;
  undefined8 *in_RDI;
  Bag *in_stack_ffffffffffffffa8;
  Diagnostics *diagnostics;
  NumberParser *this_00;
  Preprocessor *in_stack_ffffffffffffffd8;
  ParserBase *in_stack_ffffffffffffffe0;
  
  ParserBase::ParserBase(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::SyntaxFactory::SyntaxFactory
            ((SyntaxFactory *)(in_RDI + 0x1c),(BumpAllocator *)*in_RDI);
  in_RDI[0x1d] = 0;
  this_00 = (NumberParser *)(in_RDI + 0x1e);
  PVar1 = Bag::getOrDefault<slang::parsing::ParserOptions>(in_stack_ffffffffffffffa8);
  *(ParserOptions *)this_00 = PVar1;
  diagnostics = (Diagnostics *)(in_RDI + 0x1f);
  ParserMetadata::ParserMetadata(in_RSI);
  languageVersion = (LanguageVersion)((ulong)(in_RDI + 0x3a) >> 0x20);
  alloc = (BumpAllocator *)ParserBase::getDiagnostics((ParserBase *)0x878e18);
  NumberParser::NumberParser(this_00,diagnostics,alloc,languageVersion);
  SmallVector<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_4UL>
  ::SmallVector((SmallVector<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_4UL>
                 *)0x878e4e);
  in_RDI[0x6d] = 0;
  *(undefined4 *)(in_RDI + 0x6e) = 0;
  return;
}

Assistant:

Parser::Parser(Preprocessor& preprocessor, const Bag& options) :
    ParserBase::ParserBase(preprocessor), factory(alloc),
    parseOptions(options.getOrDefault<ParserOptions>()),
    numberParser(getDiagnostics(), alloc, parseOptions.languageVersion) {
}